

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_block.cpp
# Opt level: O0

void multikey_block<1024u,unsigned_short>(uchar **strings,size_t n,size_t depth)

{
  uchar *puVar1;
  value_type ppuVar2;
  value_type vVar3;
  value_type vVar4;
  value_type pppuVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Block ppuVar11;
  size_t sVar12;
  bool bVar13;
  uint16_t uVar14;
  int iVar15;
  reference pvVar16;
  reference pvVar17;
  reference pvVar18;
  reference pppuVar19;
  reference ppppuVar20;
  unsigned_long *puVar21;
  reference pppuVar22;
  vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> local_178;
  Block local_158;
  Block tmp;
  size_t block_overlap;
  unsigned_long local_140;
  unsigned_long local_138;
  size_t block_items;
  size_t bucket_pos;
  _List_const_iterator<unsigned_char_**> local_120;
  const_iterator it;
  ulong uStack_110;
  uint i_3;
  size_t pos;
  Block block_1;
  uint b_1;
  unsigned_short c_1;
  Block block;
  uint b;
  uint uStack_e4;
  unsigned_short c;
  uint j_1;
  uint j;
  array<unsigned_short,_32UL> cache;
  size_t i;
  ulong local_90;
  size_t i_2;
  ulong local_80;
  size_t i_1;
  undefined1 local_70 [8];
  array<unsigned_long,_3UL> bucketsize;
  allocator<unsigned_char_***> local_41;
  undefined1 local_40 [8];
  BackLinks backlinks;
  unsigned_short partval;
  size_t depth_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 10000) {
    mkqsort(strings,(int)n,(int)depth);
  }
  else {
    if (n < 0x401) {
      __assert_fail("n > B",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                    ,0x48,
                    "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                   );
    }
    if ((multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
         buckets_abi_cxx11_ == '\0') &&
       (iVar15 = __cxa_guard_acquire(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                      ::buckets_abi_cxx11_), iVar15 != 0)) {
      std::array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>::
      array(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             buckets_abi_cxx11_);
      __cxa_atexit(std::
                   array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>
                   ::~array,&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                             ::buckets_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                           ::buckets_abi_cxx11_);
    }
    if ((multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
         freeblocks_abi_cxx11_ == '\0') &&
       (iVar15 = __cxa_guard_acquire(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                      ::freeblocks_abi_cxx11_), iVar15 != 0)) {
      std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::list
                (&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::freeblocks_abi_cxx11_);
      __cxa_atexit(std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::~list,
                   &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::freeblocks_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                           ::freeblocks_abi_cxx11_);
    }
    backlinks.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_2_ = pseudo_median<unsigned_short>(strings,n,depth)
    ;
    std::allocator<unsigned_char_***>::allocator(&local_41);
    std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::vector
              ((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *)local_40,
               (n >> 10) + 1,&local_41);
    std::allocator<unsigned_char_***>::~allocator(&local_41);
    i_1 = 0;
    std::array<unsigned_long,_3UL>::fill((array<unsigned_long,_3UL> *)local_70,&i_1);
    pvVar16 = std::
              array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>::
              operator[](&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                          ::buckets_abi_cxx11_,0);
    std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::clear(pvVar16);
    pvVar16 = std::
              array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>::
              operator[](&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                          ::buckets_abi_cxx11_,1);
    std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::clear(pvVar16);
    pvVar16 = std::
              array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>::
              operator[](&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                          ::buckets_abi_cxx11_,2);
    std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::clear(pvVar16);
    bVar13 = std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::empty
                       (&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                         ::freeblocks_abi_cxx11_);
    if (!bVar13) {
      __assert_fail("freeblocks.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                    ,0x54,
                    "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                   );
    }
    for (local_80 = 0; local_80 < 0x20; local_80 = local_80 + 1) {
      i_2 = (size_t)std::array<unsigned_char_*,_32768UL>::operator[]
                              (&multikey_block<1024U,_unsigned_short>::temp_space,local_80 << 10);
      std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                (&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::freeblocks_abi_cxx11_,(value_type *)&i_2);
    }
    for (local_90 = 0; local_90 < n - (n & 0x3ff); local_90 = local_90 + 0x400) {
      i = (size_t)(strings + local_90);
      std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                (&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::freeblocks_abi_cxx11_,(value_type *)&i);
    }
    cache._M_elems[0x1c] = 0;
    cache._M_elems[0x1d] = 0;
    cache._M_elems[0x1e] = 0;
    cache._M_elems[0x1f] = 0;
    for (; (ulong)cache._M_elems._56_8_ < n - (n & 0x1f);
        cache._M_elems._56_8_ = cache._M_elems._56_8_ + 0x20) {
      for (uStack_e4 = 0; uStack_e4 < 0x20; uStack_e4 = uStack_e4 + 1) {
        uVar14 = get_char<unsigned_short>(strings[cache._M_elems._56_8_ + (ulong)uStack_e4],depth);
        pvVar17 = std::array<unsigned_short,_32UL>::operator[]
                            ((array<unsigned_short,_32UL> *)&j_1,(ulong)uStack_e4);
        *pvVar17 = uVar14;
      }
      for (b = 0; b < 0x20; b = b + 1) {
        pvVar17 = std::array<unsigned_short,_32UL>::operator[]
                            ((array<unsigned_short,_32UL> *)&j_1,(ulong)b);
        block._6_2_ = *pvVar17;
        block._0_4_ = get_bucket<unsigned_short>
                                (block._6_2_,
                                 backlinks.
                                 super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
        pvVar18 = std::array<unsigned_long,_3UL>::operator[]
                            ((array<unsigned_long,_3UL> *)local_70,(ulong)(uint)block);
        if ((*pvVar18 & 0x3ff) == 0) {
          _b_1 = take_free_block(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                  ::freeblocks_abi_cxx11_);
          pvVar16 = std::
                    array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>
                    ::operator[](&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                  ::buckets_abi_cxx11_,(ulong)(uint)block);
          std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                    (pvVar16,(value_type *)&b_1);
          if ((strings <= _b_1) && (_b_1 < strings + n)) {
            pvVar16 = std::
                      array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>
                      ::operator[](&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                    ::buckets_abi_cxx11_,(ulong)(uint)block);
            pppuVar19 = std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::
                        back(pvVar16);
            auVar6._8_8_ = (long)_b_1 - (long)strings >> 0x3f;
            auVar6._0_8_ = (long)_b_1 - (long)strings >> 3;
            ppppuVar20 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                         operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *
                                    )local_40,SUB168(auVar6 / SEXT816(0x400),0));
            *ppppuVar20 = pppuVar19;
          }
        }
        pvVar16 = std::
                  array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>
                  ::operator[](&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                ::buckets_abi_cxx11_,(ulong)(uint)block);
        bVar13 = std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::empty
                           (pvVar16);
        if (((bVar13 ^ 0xffU) & 1) == 0) {
          __assert_fail("not buckets[b].empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                        ,0x6e,
                        "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                       );
        }
        puVar1 = strings[cache._M_elems._56_8_ + (ulong)b];
        pvVar16 = std::
                  array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>
                  ::operator[](&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                ::buckets_abi_cxx11_,(ulong)(uint)block);
        pppuVar19 = std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::back
                              (pvVar16);
        ppuVar2 = *pppuVar19;
        pvVar18 = std::array<unsigned_long,_3UL>::operator[]
                            ((array<unsigned_long,_3UL> *)local_70,(ulong)(uint)block);
        ppuVar2[*pvVar18 & 0x3ff] = puVar1;
        pvVar18 = std::array<unsigned_long,_3UL>::operator[]
                            ((array<unsigned_long,_3UL> *)local_70,(ulong)(uint)block);
        *pvVar18 = *pvVar18 + 1;
      }
    }
    for (; (ulong)cache._M_elems._56_8_ < n; cache._M_elems._56_8_ = cache._M_elems._56_8_ + 1) {
      block_1._6_2_ = get_char<unsigned_short>(strings[cache._M_elems._56_8_],depth);
      block_1._0_4_ =
           get_bucket<unsigned_short>
                     (block_1._6_2_,
                      backlinks.
                      super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
      pvVar18 = std::array<unsigned_long,_3UL>::operator[]
                          ((array<unsigned_long,_3UL> *)local_70,(ulong)(uint)block_1);
      if ((*pvVar18 & 0x3ff) == 0) {
        pos = (size_t)take_free_block(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                       ::freeblocks_abi_cxx11_);
        pvVar16 = std::
                  array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>
                  ::operator[](&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                ::buckets_abi_cxx11_,(ulong)(uint)block_1);
        std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                  (pvVar16,(value_type *)&pos);
        if ((strings <= pos) && (pos < strings + n)) {
          pvVar16 = std::
                    array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>
                    ::operator[](&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                  ::buckets_abi_cxx11_,(ulong)(uint)block_1);
          pppuVar19 = std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::back
                                (pvVar16);
          auVar7._8_8_ = (long)(pos - (long)strings) >> 0x3f;
          auVar7._0_8_ = (long)(pos - (long)strings) >> 3;
          ppppuVar20 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                       operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *)
                                  local_40,SUB168(auVar7 / SEXT816(0x400),0));
          *ppppuVar20 = pppuVar19;
        }
      }
      pvVar16 = std::
                array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>
                ::operator[](&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                              ::buckets_abi_cxx11_,(ulong)(uint)block_1);
      bVar13 = std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::empty
                         (pvVar16);
      if (((bVar13 ^ 0xffU) & 1) == 0) {
        __assert_fail("not buckets[b].empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                      ,0x80,
                      "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                     );
      }
      puVar1 = strings[cache._M_elems._56_8_];
      pvVar16 = std::
                array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>
                ::operator[](&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                              ::buckets_abi_cxx11_,(ulong)(uint)block_1);
      pppuVar19 = std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::back
                            (pvVar16);
      ppuVar2 = *pppuVar19;
      pvVar18 = std::array<unsigned_long,_3UL>::operator[]
                          ((array<unsigned_long,_3UL> *)local_70,(ulong)(uint)block_1);
      ppuVar2[*pvVar18 & 0x3ff] = puVar1;
      pvVar18 = std::array<unsigned_long,_3UL>::operator[]
                          ((array<unsigned_long,_3UL> *)local_70,(ulong)(uint)block_1);
      *pvVar18 = *pvVar18 + 1;
    }
    pvVar18 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,0);
    vVar3 = *pvVar18;
    pvVar18 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,1);
    vVar4 = *pvVar18;
    pvVar18 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,2);
    if (vVar3 + vVar4 + *pvVar18 != n) {
      __assert_fail("bucketsize[0]+bucketsize[1]+bucketsize[2]==n",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                    ,0x84,
                    "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                   );
    }
    uStack_110 = 0;
    for (it._M_node._4_4_ = 0; it._M_node._4_4_ < 3; it._M_node._4_4_ = it._M_node._4_4_ + 1) {
      pvVar18 = std::array<unsigned_long,_3UL>::operator[]
                          ((array<unsigned_long,_3UL> *)local_70,(ulong)it._M_node._4_4_);
      if (*pvVar18 != 0) {
        pvVar16 = std::
                  array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>
                  ::operator[](&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                ::buckets_abi_cxx11_,(ulong)it._M_node._4_4_);
        bucket_pos = (size_t)std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                             ::begin(pvVar16);
        std::_List_const_iterator<unsigned_char_**>::_List_const_iterator
                  (&local_120,(iterator *)&bucket_pos);
        for (block_items = 0; sVar12 = block_items,
            pvVar18 = std::array<unsigned_long,_3UL>::operator[]
                                ((array<unsigned_long,_3UL> *)local_70,(ulong)it._M_node._4_4_),
            sVar12 < *pvVar18; block_items = block_items + 0x400) {
          local_140 = 0x400;
          pvVar18 = std::array<unsigned_long,_3UL>::operator[]
                              ((array<unsigned_long,_3UL> *)local_70,(ulong)it._M_node._4_4_);
          block_overlap = *pvVar18 - block_items;
          puVar21 = std::min<unsigned_long>(&local_140,&block_overlap);
          local_138 = *puVar21;
          tmp = (Block)((uStack_110 + local_138) - 1 >> 10);
          pppuVar22 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_120);
          if (*pppuVar22 == strings + uStack_110) {
            if ((uStack_110 & 0x3ff) != 0) {
              __assert_fail("pos%B==0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                            ,0x92,
                            "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                           );
            }
            ppppuVar20 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                         operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *
                                    )local_40,uStack_110 >> 10);
            *ppppuVar20 = (value_type)0x0;
          }
          else {
            ppppuVar20 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                         operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *
                                    )local_40,(size_type)tmp);
            if (*ppppuVar20 != (value_type)0x0) {
              local_158 = take_free_block(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                           ::freeblocks_abi_cxx11_);
              while (strings <= local_158 && local_158 < strings + uStack_110) {
                local_158 = take_free_block(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                             ::freeblocks_abi_cxx11_);
              }
              if ((strings <= local_158) && (local_158 < strings + n)) {
                auVar8._8_8_ = (long)local_158 - (long)strings >> 0x3f;
                auVar8._0_8_ = (long)local_158 - (long)strings >> 3;
                ppppuVar20 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                             operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                         *)local_40,SUB168(auVar8 / SEXT816(0x400),0));
                if (*ppppuVar20 != (value_type)0x0) {
                  __assert_fail("backlinks[(tmp-strings)/B]==0",
                                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                                ,0xa2,
                                "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                               );
                }
                ppppuVar20 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                             operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                         *)local_40,(size_type)tmp);
                pppuVar5 = *ppppuVar20;
                auVar9._8_8_ = (long)local_158 - (long)strings >> 0x3f;
                auVar9._0_8_ = (long)local_158 - (long)strings >> 3;
                ppppuVar20 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                             operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                         *)local_40,SUB168(auVar9 / SEXT816(0x400),0));
                *ppppuVar20 = pppuVar5;
              }
              ppuVar11 = local_158;
              ppppuVar20 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                           operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                       *)local_40,(size_type)tmp);
              memcpy(ppuVar11,**ppppuVar20,0x2000);
              ppuVar11 = local_158;
              ppppuVar20 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                           operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                       *)local_40,(size_type)tmp);
              **ppppuVar20 = ppuVar11;
              ppppuVar20 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                           operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                       *)local_40,(size_type)tmp);
              *ppppuVar20 = (value_type)0x0;
            }
            pppuVar22 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_120);
            if ((strings <= *pppuVar22) &&
               (pppuVar22 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_120),
               *pppuVar22 < strings + n)) {
              pppuVar22 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_120);
              if (*pppuVar22 <= strings + uStack_110) {
                __assert_fail("*it > strings+pos",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                              ,0xaa,
                              "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                             );
              }
              pppuVar22 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_120);
              auVar10._8_8_ = (long)*pppuVar22 - (long)strings >> 0x3f;
              auVar10._0_8_ = (long)*pppuVar22 - (long)strings >> 3;
              ppppuVar20 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                           operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                       *)local_40,SUB168(auVar10 / SEXT816(0x400),0));
              *ppppuVar20 = (value_type)0x0;
            }
            pppuVar22 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_120);
            memcpy(strings + uStack_110,*pppuVar22,local_138 << 3);
            pppuVar22 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_120);
            if ((*pppuVar22 < strings) ||
               (pppuVar22 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_120),
               strings + n <= *pppuVar22)) {
              pppuVar22 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_120);
              std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_front
                        (&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                          ::freeblocks_abi_cxx11_,pppuVar22);
            }
            else {
              pppuVar22 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_120);
              std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                        (&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                          ::freeblocks_abi_cxx11_,pppuVar22);
            }
          }
          uStack_110 = local_138 + uStack_110;
          std::_List_const_iterator<unsigned_char_**>::operator++(&local_120);
        }
      }
    }
    std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::clear
              (&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
                freeblocks_abi_cxx11_);
    std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::clear
              ((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *)local_40);
    local_178.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::vector(&local_178);
    std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::swap
              (&local_178,(vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *)local_40)
    ;
    std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::~vector(&local_178);
    pvVar18 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,0);
    multikey_block<1024u,unsigned_short>(strings,*pvVar18,depth);
    bVar13 = is_end<unsigned_short>
                       (backlinks.
                        super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
    if (!bVar13) {
      pvVar18 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,0);
      vVar3 = *pvVar18;
      pvVar18 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,1);
      multikey_block<1024u,unsigned_short>(strings + vVar3,*pvVar18,depth + 2);
    }
    pvVar18 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,0);
    vVar3 = *pvVar18;
    pvVar18 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,1);
    vVar4 = *pvVar18;
    pvVar18 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,2);
    multikey_block<1024u,unsigned_short>(strings + vVar3 + vVar4,*pvVar18,depth);
    std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::~vector
              ((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *)local_40);
  }
  return;
}

Assistant:

static void
multikey_block(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 10000) {
		mkqsort(strings, n, depth);
		return;
	}
	assert(n > B);
	static Buckets buckets;
	static std::array<unsigned char*, 32*B> temp_space;
	static FreeBlocks freeblocks;
	const CharT partval = pseudo_median<CharT>(strings, n, depth);
	BackLinks backlinks(n/B+1);
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	buckets[0].clear();
	buckets[1].clear();
	buckets[2].clear();
	// Initialize our list of free blocks.
	assert(freeblocks.empty());
	for (size_t i=0; i < 32; ++i)
		freeblocks.push_back(&temp_space[i*B]);
	for (size_t i=0; i < n-n%B; i+=B)
		freeblocks.push_back(strings+i);
	// Distribute strings to buckets. Use a small cache to reduce memory
	// stalls. The exact size of the cache is not very important.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const CharT c = cache[j];
			const unsigned b = get_bucket(c, partval);
			if (bucketsize[b] % B == 0) {
				Block block = take_free_block(freeblocks);
				buckets[b].push_back(block);
				// Backlinks must be set for those blocks, that
				// use the original string array space.
				if (block >= strings && block < strings+n) {
					backlinks[(block-strings)/B] =
						&(buckets[b].back());
				}
			}
			assert(not buckets[b].empty());
			buckets[b].back()[bucketsize[b] % B] = strings[i+j];
			++bucketsize[b];
		}
	}
	for (; i < n; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		if (bucketsize[b] % B == 0) {
			Block block = take_free_block(freeblocks);
			buckets[b].push_back(block);
			// Backlinks must be set for those blocks, that
			// use the original string array space.
			if (block >= strings && block < strings+n) {
				backlinks[(block-strings)/B] =
					&(buckets[b].back());
			}
		}
		assert(not buckets[b].empty());
		buckets[b].back()[bucketsize[b] % B] = strings[i];
		++bucketsize[b];
	}
	assert(bucketsize[0]+bucketsize[1]+bucketsize[2]==n);
	// Process each bucket, and copy all strings in that bucket to proper
	// place in the original string pointer array. This means that those
	// positions that are occupied by other blocks must be moved to free
	// space etc.
	size_t pos = 0;
	for (unsigned i=0; i < 3; ++i) {
		if (bucketsize[i] == 0) continue;
		Bucket::const_iterator it = buckets[i].begin();
		for (size_t bucket_pos=0; bucket_pos < bucketsize[i]; ++it, bucket_pos+=B) {
			const size_t block_items = std::min(size_t(B), bucketsize[i]-bucket_pos);
			const size_t block_overlap = (pos+block_items-1)/B;
			if (*it == (strings+pos)) {
				// Already at correct place.
				assert(pos%B==0);
				backlinks[pos/B] = 0;
				pos += block_items;
				continue;
			}
			// Don't overwrite the block in the position we are
			// about to write to, but copy it into safety.
			if (backlinks[block_overlap]) {
				// Take a free block. The block can be 'stale',
				// i.e. it can point to positions we have
				// already copied new strings into. Take free
				// blocks until we have non-stale block.
				Block tmp = take_free_block(freeblocks);
				while (tmp >= strings && tmp < strings+pos)
					tmp = take_free_block(freeblocks);
				if (tmp >= strings && tmp < strings+n) {
					assert(backlinks[(tmp-strings)/B]==0);
					backlinks[(tmp-strings)/B] = backlinks[block_overlap];
				}
				memcpy(tmp, *(backlinks[block_overlap]), B*sizeof(unsigned char*));
				*(backlinks[block_overlap]) = tmp;
				backlinks[block_overlap] = 0;
			}
			if (*it >= strings && *it < strings+n) {
				assert(*it > strings+pos);
				backlinks[(*it-strings)/B] = 0;
			}
			// Copy string pointers to correct position.
			memcpy(strings+pos, *it, block_items*sizeof(unsigned char*));
			// Return block for later use. Favor those in the
			// temporary space.
			if (*it >= strings && *it < strings+n) {
				freeblocks.push_back(*it);
			} else {
				freeblocks.push_front(*it);
			}
			pos += block_items;
		}
	}
	freeblocks.clear();
	backlinks.clear(); BackLinks().swap(backlinks);
	multikey_block<B, CharT>(strings, bucketsize[0], depth);
	if (not is_end(partval))
		multikey_block<B, CharT>(strings+bucketsize[0], bucketsize[1],
				depth+sizeof(CharT));
	multikey_block<B, CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth);
}